

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

ctl_named_node_t * experimental_arenas_i_index(tsdn_t *tsdn,size_t *mib,size_t miblen,size_t i)

{
  _Bool _Var1;
  malloc_mutex_t *in_RDX;
  tsdn_t *in_RSI;
  tsdn_t *in_RDI;
  ctl_named_node_t *ret;
  size_t in_stack_ffffffffffffffd8;
  ctl_named_node_t *pcVar2;
  
  malloc_mutex_lock(in_RDI,(malloc_mutex_t *)in_RSI);
  _Var1 = ctl_arenas_i_verify(in_stack_ffffffffffffffd8);
  if (_Var1) {
    pcVar2 = (ctl_named_node_t *)0x0;
  }
  else {
    pcVar2 = super_experimental_arenas_i_node;
  }
  malloc_mutex_unlock(in_RSI,in_RDX);
  return pcVar2;
}

Assistant:

static const ctl_named_node_t *
experimental_arenas_i_index(tsdn_t *tsdn, const size_t *mib,
    size_t miblen, size_t i) {
	const ctl_named_node_t *ret;

	malloc_mutex_lock(tsdn, &ctl_mtx);
	if (ctl_arenas_i_verify(i)) {
		ret = NULL;
		goto label_return;
	}
	ret = super_experimental_arenas_i_node;
label_return:
	malloc_mutex_unlock(tsdn, &ctl_mtx);
	return ret;
}